

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

bool ghc::filesystem::equivalent(path *p1,path *p2)

{
  int code;
  bool bVar1;
  filesystem_error *this;
  error_code ec_00;
  error_code ec;
  error_code local_58;
  string local_48;
  
  local_58._M_value = 0;
  local_58._M_cat = (error_category *)std::_V2::system_category();
  bVar1 = equivalent(p1,p2,&local_58);
  code = local_58._M_value;
  if (local_58._M_value == 0) {
    return bVar1;
  }
  this = (filesystem_error *)__cxa_allocate_exception(0x90);
  detail::systemErrorText<int>(&local_48,code);
  ec_00._4_4_ = 0;
  ec_00._M_value = code;
  ec_00._M_cat = local_58._M_cat;
  filesystem_error::filesystem_error(this,&local_48,p1,p2,ec_00);
  __cxa_throw(this,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE bool equivalent(const path& p1, const path& p2)
{
    std::error_code ec;
    bool result = equivalent(p1, p2, ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), p1, p2, ec);
    }
    return result;
}